

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

void __thiscall
libtorrent::session_stats_alert::session_stats_alert
          (session_stats_alert *this,stack_allocator *param_1,counters *cnt)

{
  int64_t iVar1;
  int i;
  long lVar2;
  array<std::int64_t,_counters::num_counters> arr;
  int64_t local_970 [299];
  
  alert::alert(&this->super_alert);
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__alert_00431de0;
  for (lVar2 = 0; lVar2 != 299; lVar2 = lVar2 + 1) {
    iVar1 = libtorrent::counters::operator[](cnt,(int)lVar2);
    local_970[lVar2] = iVar1;
  }
  memcpy(&this->values,local_970,0x958);
  return;
}

Assistant:

session_stats_alert::session_stats_alert(aux::stack_allocator&, struct counters const& cnt)
		: values(counters_to_array(cnt))
	{}